

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O2

void __thiscall TadsHttpReqResult::~TadsHttpReqResult(TadsHttpReqResult *this)

{
  (this->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__TadsHttpReqResult_00343330;
  CVmObjTable::delete_global_var(&G_obj_table_X,this->idg);
  if (this->reply != (CVmDataSource *)0x0) {
    (*this->reply->_vptr_CVmDataSource[1])();
  }
  if (this->hdrs != (char *)0x0) {
    operator_delete__(this->hdrs);
  }
  if (this->loc != (char *)0x0) {
    lib_free_str(this->loc);
  }
  TadsMessage::~TadsMessage((TadsMessage *)this);
  return;
}

Assistant:

~TadsHttpReqResult()
    {
        /* establish the global context */
        VMGLOB_PTR(vmg);

        /* delete our ID global */
        G_obj_table->delete_global_var(idg);

        /* delete the reply object */
        if (reply != 0)
            delete reply;

        /* free the reply headers */
        if (hdrs != 0)
            delete [] hdrs;

        /* free the redirect location string, if we have one */
        if (loc != 0)
            lib_free_str(loc);
    }